

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void trace_example(void)

{
  shared_ptr<spdlog::logger> logger;
  allocator local_549;
  undefined1 local_548 [48];
  executor local_518;
  executor local_368;
  executor local_1b8;
  
  spdlog::details::executor::executor(&local_1b8);
  spdlog::details::executor::~executor(&local_1b8);
  spdlog::details::executor::executor(&local_368);
  spdlog::details::executor::~executor(&local_368);
  std::__cxx11::string::string((string *)(local_548 + 0x10),"file_logger",&local_549);
  spdlog::get((string *)local_548);
  std::__cxx11::string::~string((string *)(local_548 + 0x10));
  spdlog::details::executor::executor(&local_518);
  spdlog::details::executor::~executor(&local_518);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_548 + 8));
  return;
}

Assistant:

void trace_example()
{
    // trace from default logger
    SPDLOG_TRACE("Some trace message.. {} ,{}", 1, 3.23);
    // debug from default logger
    SPDLOG_DEBUG("Some debug message.. {} ,{}", 1, 3.23);

    // trace from logger object
    auto logger = spdlog::get("file_logger");
    SPDLOG_LOGGER_TRACE(logger, "another trace message");
}